

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdjs_transaction_base.cpp
# Opt level: O2

ExtractScriptData *
cfd::js::api::TransactionStructApiBase::ExtractLockingScript
          (ExtractScriptData *__return_storage_ptr__,Script *locking_script)

{
  vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_> *this;
  LockingScriptType LVar1;
  char cVar2;
  WitnessVersion WVar3;
  ScriptOperator *pSVar4;
  int64_t iVar5;
  ByteData program;
  vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_> elems;
  long local_60;
  string script_type;
  
  (__return_storage_ptr__->pushed_datas).
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (__return_storage_ptr__->pushed_datas).
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->pushed_datas).
  super__Vector_base<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  __return_storage_ptr__->witness_version = kVersionNone;
  this = &__return_storage_ptr__->pushed_datas;
  script_type._M_dataplus._M_p = (pointer)&script_type.field_2;
  script_type._M_string_length = 0;
  script_type.field_2._M_local_buf[0] = '\0';
  cfd::core::Script::GetElementList();
  if (local_60 - _elems == 0x60) {
    pSVar4 = (ScriptOperator *)cfd::core::ScriptElement::GetOpCode();
    cVar2 = cfd::core::ScriptOperator::operator==
                      (pSVar4,(ScriptOperator *)&core::ScriptOperator::OP_TRUE);
    if (cVar2 != '\0') {
      __return_storage_ptr__->script_type = kTrue;
      goto LAB_008b58dd;
    }
  }
  cVar2 = cfd::core::Script::IsEmpty();
  if (cVar2 != '\0') {
    __return_storage_ptr__->script_type = kFee;
    goto LAB_008b58dd;
  }
  cVar2 = cfd::core::Script::IsP2shScript();
  if (cVar2 == '\0') {
    cVar2 = cfd::core::Script::IsWitnessProgram();
    if (cVar2 == '\0') {
      if (local_60 != _elems) {
        pSVar4 = (ScriptOperator *)cfd::core::ScriptElement::GetOpCode();
        cVar2 = cfd::core::ScriptOperator::operator==
                          (pSVar4,(ScriptOperator *)&core::ScriptOperator::OP_RETURN);
        if (cVar2 != '\0') {
          __return_storage_ptr__->script_type = kNullData;
          goto LAB_008b58dd;
        }
      }
      cVar2 = cfd::core::Script::IsP2pkScript();
      if (cVar2 == '\0') {
        cVar2 = cfd::core::Script::IsP2pkhScript();
        if (cVar2 == '\0') {
          cVar2 = cfd::core::Script::IsMultisigScript();
          if (cVar2 == '\0') {
            __return_storage_ptr__->script_type = kNonStandard;
          }
          else {
            __return_storage_ptr__->script_type = kMultisig;
            iVar5 = cfd::core::ScriptElement::GetNumber();
            __return_storage_ptr__->req_sigs = iVar5;
            while (_elems = _elems + 0x60, _elems != local_60 + -0xc0) {
              cfd::core::ScriptElement::GetBinaryData();
              std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
                        (this,(value_type *)&program);
              std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
                        ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&program);
            }
          }
          goto LAB_008b58dd;
        }
        __return_storage_ptr__->script_type = kPayToPubkeyHash;
        cfd::core::ScriptElement::GetBinaryData();
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
        emplace_back<cfd::core::ByteData>(this,&program);
      }
      else {
        __return_storage_ptr__->script_type = kPayToPubkey;
        cfd::core::ScriptElement::GetBinaryData();
        std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
        emplace_back<cfd::core::ByteData>(this,&program);
      }
    }
    else {
      WVar3 = cfd::core::ScriptElement::GetNumber();
      cfd::core::ScriptElement::GetBinaryData();
      __return_storage_ptr__->witness_version = WVar3 & 0xff;
      cVar2 = cfd::core::Script::IsP2wpkhScript();
      if (cVar2 == '\0') {
        cVar2 = cfd::core::Script::IsP2wshScript();
        if (cVar2 == '\0') {
          cVar2 = cfd::core::Script::IsTaprootScript();
          if (cVar2 == '\0') {
            if ((WVar3 & 0xff) == kVersion0) {
              __return_storage_ptr__->script_type = kNonStandard;
              __return_storage_ptr__->witness_version = kVersionNone;
              goto LAB_008b58d3;
            }
            LVar1 = kWitnessUnknown;
          }
          else {
            LVar1 = kWitnessV1Taproot;
          }
        }
        else {
          LVar1 = kWitnessV0ScriptHash;
        }
      }
      else {
        LVar1 = kWitnessV0KeyHash;
      }
      __return_storage_ptr__->script_type = LVar1;
      std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::push_back
                (this,&program);
    }
  }
  else {
    __return_storage_ptr__->script_type = kPayToScriptHash;
    cfd::core::ScriptElement::GetBinaryData();
    std::vector<cfd::core::ByteData,_std::allocator<cfd::core::ByteData>_>::
    emplace_back<cfd::core::ByteData>(this,&program);
  }
LAB_008b58d3:
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            ((_Vector_base<unsigned_char,_std::allocator<unsigned_char>_> *)&program);
LAB_008b58dd:
  std::vector<cfd::core::ScriptElement,_std::allocator<cfd::core::ScriptElement>_>::~vector(&elems);
  std::__cxx11::string::~string((string *)&script_type);
  return __return_storage_ptr__;
}

Assistant:

ExtractScriptData TransactionStructApiBase::ExtractLockingScript(
    Script locking_script) {
  ExtractScriptData extract_data;

  std::string script_type;
  std::vector<ScriptElement> elems = locking_script.GetElementList();
  // FIXME(fujita-cg): judge anycanspent_aremine flag
  if (elems.size() == 1 && elems[0].GetOpCode() == ScriptOperator::OP_TRUE) {
    extract_data.script_type = LockingScriptType::kTrue;
    return extract_data;
  }
#ifndef CFD_DISABLE_ELEMENTS
  if (locking_script.IsEmpty()) {
    // empty
    extract_data.script_type = LockingScriptType::kFee;
    return extract_data;
  }
#endif  // CFD_DISABLE_ELEMENTS
  if (locking_script.IsP2shScript()) {
    // P2shScript
    extract_data.script_type = LockingScriptType::kPayToScriptHash;
    extract_data.pushed_datas.push_back(elems[1].GetBinaryData());
    return extract_data;
  }

  // WitnessData
  if (locking_script.IsWitnessProgram()) {
    uint8_t witness_version = static_cast<uint8_t>(elems[0].GetNumber());
    ByteData program = elems[1].GetBinaryData();
    extract_data.witness_version =
        static_cast<WitnessVersion>(witness_version);
    if (locking_script.IsP2wpkhScript()) {
      // tx witness keyhash
      extract_data.script_type = LockingScriptType::kWitnessV0KeyHash;
      extract_data.pushed_datas.push_back(program);
    } else if (locking_script.IsP2wshScript()) {
      // tx witness scripthash
      extract_data.script_type = LockingScriptType::kWitnessV0ScriptHash;
      extract_data.pushed_datas.push_back(program);
    } else if (locking_script.IsTaprootScript()) {
      extract_data.script_type = LockingScriptType::kWitnessV1Taproot;
      extract_data.pushed_datas.push_back(program);
    } else if (witness_version != 0) {
      // tx witness unknown
      extract_data.script_type = LockingScriptType::kWitnessUnknown;
      extract_data.pushed_datas.push_back(program);
    } else {
      // non standard
      extract_data.script_type = LockingScriptType::kNonStandard;
      extract_data.witness_version = WitnessVersion::kVersionNone;
    }
    return extract_data;
  }

  if (elems.size() >= 1 && elems[0].GetOpCode() == ScriptOperator::OP_RETURN) {
    // tx null data
    extract_data.script_type = LockingScriptType::kNullData;
    return extract_data;
  }
  if (locking_script.IsP2pkScript()) {
    // tx pubkey
    extract_data.script_type = LockingScriptType::kPayToPubkey;
    extract_data.pushed_datas.push_back(elems[0].GetBinaryData());
    return extract_data;
  }
  if (locking_script.IsP2pkhScript()) {
    // tx pubkey hash
    extract_data.script_type = LockingScriptType::kPayToPubkeyHash;
    extract_data.pushed_datas.push_back(elems[2].GetBinaryData());
    return extract_data;
  }
  if (locking_script.IsMultisigScript()) {
    // tx multisig
    extract_data.script_type = LockingScriptType::kMultisig;
    decltype(elems)::const_iterator itr = elems.cbegin();
    extract_data.req_sigs = (*itr).GetNumber();
    ++itr;
    for (; itr != (elems.cend() - 2); ++itr) {
      ByteData pubkey_byte = (*itr).GetBinaryData();
      extract_data.pushed_datas.push_back(pubkey_byte);
    }
    return extract_data;
  }

  // tx nonstandard
  extract_data.script_type = LockingScriptType::kNonStandard;
  return extract_data;
}